

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall TTD::EventLog::InitializeEventListVTable(EventLog *this)

{
  EventLogEntryVTableEntry *pEVar1;
  
  pEVar1 = (EventLogEntryVTableEntry *)
           SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(&this->m_miscSlabAllocator,0xd50);
  this->m_eventListVTable = pEVar1;
  pEVar1[1].ContextKind = GlobalAPIWrapper;
  pEVar1[1].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[1].UnloadFP = NSLogEvents::SnapshotEventLogEntry_UnloadEventMemory;
  pEVar1[1].EmitFP = NSLogEvents::SnapshotEventLogEntry_Emit;
  pEVar1[1].ParseFP = NSLogEvents::SnapshotEventLogEntry_Parse;
  pEVar1[1].DataSize = 0x40;
  pEVar1 = this->m_eventListVTable;
  pEVar1[2].ContextKind = GlobalAPIWrapper;
  pEVar1[2].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[2].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[2].EmitFP = NSLogEvents::EventLoopYieldPointEntry_Emit;
  pEVar1[2].ParseFP = NSLogEvents::EventLoopYieldPointEntry_Parse;
  pEVar1[2].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[3].ContextKind = None;
  pEVar1[3].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[3].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[3].EmitFP = NSLogEvents::CodeLoadEventLogEntry_Emit;
  pEVar1[3].ParseFP = NSLogEvents::CodeLoadEventLogEntry_Parse;
  pEVar1[3].DataSize = 0x14;
  pEVar1 = this->m_eventListVTable;
  pEVar1[4].ContextKind = None;
  pEVar1[4].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[4].UnloadFP = NSLogEvents::TelemetryEventLogEntry_UnloadEventMemory;
  pEVar1[4].EmitFP = NSLogEvents::TelemetryEventLogEntry_Emit;
  pEVar1[4].ParseFP = NSLogEvents::TelemetryEventLogEntry_Parse;
  pEVar1[4].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[5].ContextKind = None;
  pEVar1[5].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[5].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[5].EmitFP = NSLogEvents::DoubleEventLogEntry_Emit;
  pEVar1[5].ParseFP = NSLogEvents::DoubleEventLogEntry_Parse;
  pEVar1[5].DataSize = 0x18;
  pEVar1 = this->m_eventListVTable;
  pEVar1[6].ContextKind = None;
  pEVar1[6].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[6].UnloadFP = NSLogEvents::StringValueEventLogEntry_UnloadEventMemory;
  pEVar1[6].EmitFP = NSLogEvents::StringValueEventLogEntry_Emit;
  pEVar1[6].ParseFP = NSLogEvents::StringValueEventLogEntry_Parse;
  pEVar1[6].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[7].ContextKind = None;
  pEVar1[7].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[7].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[7].EmitFP = NSLogEvents::RandomSeedEventLogEntry_Emit;
  pEVar1[7].ParseFP = NSLogEvents::RandomSeedEventLogEntry_Parse;
  pEVar1[7].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[8].ContextKind = None;
  pEVar1[8].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[8].UnloadFP = NSLogEvents::PropertyEnumStepEventLogEntry_UnloadEventMemory;
  pEVar1[8].EmitFP = NSLogEvents::PropertyEnumStepEventLogEntry_Emit;
  pEVar1[8].ParseFP = NSLogEvents::PropertyEnumStepEventLogEntry_Parse;
  pEVar1[8].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[9].ContextKind = None;
  pEVar1[9].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[9].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[9].EmitFP = NSLogEvents::SymbolCreationEventLogEntry_Emit;
  pEVar1[9].ParseFP = NSLogEvents::SymbolCreationEventLogEntry_Parse;
  pEVar1[9].DataSize = 0x14;
  pEVar1 = this->m_eventListVTable;
  pEVar1[10].ContextKind = None;
  pEVar1[10].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[10].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[10].EmitFP = NSLogEvents::WeakCollectionContainsEventLogEntry_Emit;
  pEVar1[10].ParseFP = NSLogEvents::WeakCollectionContainsEventLogEntry_Parse;
  pEVar1[10].DataSize = 0x14;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0xb].ContextKind = None;
  pEVar1[0xb].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[0xb].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0xb].EmitFP = NSLogEvents::ExternalCbRegisterCallEventLogEntry_Emit;
  pEVar1[0xb].ParseFP = NSLogEvents::ExternalCbRegisterCallEventLogEntry_Parse;
  pEVar1[0xb].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0xc].ContextKind = None;
  pEVar1[0xc].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[0xc].UnloadFP = NSLogEvents::ExternalCallEventLogEntry_UnloadEventMemory;
  pEVar1[0xc].EmitFP = NSLogEvents::ExternalCallEventLogEntry_Emit;
  pEVar1[0xc].ParseFP = NSLogEvents::ExternalCallEventLogEntry_Parse;
  pEVar1[0xc].DataSize = 0x50;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0xd].ContextKind = None;
  pEVar1[0xd].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[0xd].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0xd].EmitFP = NSLogEvents::ExplicitLogWriteEntry_Emit;
  pEVar1[0xd].ParseFP = NSLogEvents::ExplicitLogWriteEntry_Parse;
  pEVar1[0xd].DataSize = 0x14;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0xe].ContextKind = None;
  pEVar1[0xe].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[0xe].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0xe].EmitFP = NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Emit;
  pEVar1[0xe].ParseFP = NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Parse;
  pEVar1[0xe].DataSize = 0x48;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0xf].ContextKind = None;
  pEVar1[0xf].ExecuteFP = (fPtr_EventLogActionEntryInfoExecute)0x0;
  pEVar1[0xf].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0xf].EmitFP = NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Emit;
  pEVar1[0xf].ParseFP = NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Parse;
  pEVar1[0xf].DataSize = 0x14;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x11].ContextKind = GlobalAPIWrapper;
  pEVar1[0x11].ExecuteFP = NSLogEvents::CreateScriptContext_Execute;
  pEVar1[0x11].UnloadFP = NSLogEvents::CreateScriptContext_UnloadEventMemory;
  pEVar1[0x11].EmitFP = NSLogEvents::CreateScriptContext_Emit;
  pEVar1[0x11].ParseFP = NSLogEvents::CreateScriptContext_Parse;
  pEVar1[0x11].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x12].ContextKind = GlobalAPIWrapper;
  pEVar1[0x12].ExecuteFP = NSLogEvents::SetActiveScriptContext_Execute;
  pEVar1[0x12].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x12].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)18>;
  pEVar1[0x12].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)18>;
  pEVar1[0x12].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x13].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x13].ExecuteFP = NSLogEvents::CreateNumber_Execute;
  pEVar1[0x13].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x13].EmitFP = NSLogEvents::JsRTDoubleArgumentAction_Emit<(TTD::NSLogEvents::EventKind)19>;
  pEVar1[0x13].ParseFP =
       NSLogEvents::JsRTDoubleArgumentAction_Parse<(TTD::NSLogEvents::EventKind)19>;
  pEVar1[0x13].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x14].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x14].ExecuteFP = NSLogEvents::CreateBoolean_Execute;
  pEVar1[0x14].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x14].EmitFP =
       NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)20>;
  pEVar1[0x14].ParseFP =
       NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)20>;
  pEVar1[0x14].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x15].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x15].ExecuteFP = NSLogEvents::CreateString_Execute;
  pEVar1[0x15].UnloadFP =
       NSLogEvents::JsRTStringArgumentAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)21>;
  pEVar1[0x15].EmitFP = NSLogEvents::JsRTStringArgumentAction_Emit<(TTD::NSLogEvents::EventKind)21>;
  pEVar1[0x15].ParseFP =
       NSLogEvents::JsRTStringArgumentAction_Parse<(TTD::NSLogEvents::EventKind)21>;
  pEVar1[0x15].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x16].ContextKind = ContextAPIWrapper;
  pEVar1[0x16].ExecuteFP = NSLogEvents::CreateSymbol_Execute;
  pEVar1[0x16].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x16].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)22>;
  pEVar1[0x16].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)22>;
  pEVar1[0x16].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x17].ContextKind = ContextAPIWrapper;
  pEVar1[0x17].ExecuteFP = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)23>;
  pEVar1[0x17].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x17].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)23>;
  pEVar1[0x17].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)23>;
  pEVar1[0x17].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x18].ContextKind = ContextAPIWrapper;
  pEVar1[0x18].ExecuteFP = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)24>;
  pEVar1[0x18].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x18].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)24>;
  pEVar1[0x18].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)24>;
  pEVar1[0x18].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x19].ContextKind = ContextAPIWrapper;
  pEVar1[0x19].ExecuteFP = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)25>;
  pEVar1[0x19].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x19].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)25>;
  pEVar1[0x19].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)25>;
  pEVar1[0x19].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x1a].ContextKind = ContextAPIWrapper;
  pEVar1[0x1a].ExecuteFP = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)26>;
  pEVar1[0x1a].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x1a].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)26>;
  pEVar1[0x1a].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)26>;
  pEVar1[0x1a].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x1b].ContextKind = ContextAPIWrapper;
  pEVar1[0x1b].ExecuteFP = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)27>;
  pEVar1[0x1b].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x1b].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)27>;
  pEVar1[0x1b].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)27>;
  pEVar1[0x1b].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x1c].ContextKind = ContextAPIWrapper;
  pEVar1[0x1c].ExecuteFP = NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)28>;
  pEVar1[0x1c].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x1c].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)28>;
  pEVar1[0x1c].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)28>;
  pEVar1[0x1c].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x1d].ContextKind = ContextAPIWrapper;
  pEVar1[0x1d].ExecuteFP = NSLogEvents::VarConvertToNumber_Execute;
  pEVar1[0x1d].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x1d].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)29>;
  pEVar1[0x1d].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)29>;
  pEVar1[0x1d].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x1e].ContextKind = ContextAPIWrapper;
  pEVar1[0x1e].ExecuteFP = NSLogEvents::VarConvertToBoolean_Execute;
  pEVar1[0x1e].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x1e].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)30>;
  pEVar1[0x1e].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)30>;
  pEVar1[0x1e].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x1f].ContextKind = ContextAPIWrapper;
  pEVar1[0x1f].ExecuteFP = NSLogEvents::VarConvertToString_Execute;
  pEVar1[0x1f].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x1f].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)31>;
  pEVar1[0x1f].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)31>;
  pEVar1[0x1f].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x20].ContextKind = ContextAPIWrapper;
  pEVar1[0x20].ExecuteFP = NSLogEvents::VarConvertToObject_Execute;
  pEVar1[0x20].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x20].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)32>;
  pEVar1[0x20].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)32>;
  pEVar1[0x20].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x21].ContextKind = GlobalAPIWrapper;
  pEVar1[0x21].ExecuteFP = NSLogEvents::AddRootRef_Execute;
  pEVar1[0x21].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x21].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)33>;
  pEVar1[0x21].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)33>;
  pEVar1[0x21].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x22].ContextKind = GlobalAPIWrapper;
  pEVar1[0x22].ExecuteFP = NSLogEvents::AddWeakRootRef_Execute;
  pEVar1[0x22].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x22].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)34>;
  pEVar1[0x22].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)34>;
  pEVar1[0x22].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x23].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x23].ExecuteFP = NSLogEvents::AllocateObject_Execute;
  pEVar1[0x23].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x23].EmitFP = NSLogEvents::JsRTResultOnlyAction_Emit<(TTD::NSLogEvents::EventKind)35>;
  pEVar1[0x23].ParseFP = NSLogEvents::JsRTResultOnlyAction_Parse<(TTD::NSLogEvents::EventKind)35>;
  pEVar1[0x23].DataSize = 0x18;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x24].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x24].ExecuteFP = NSLogEvents::AllocateExternalObject_Execute;
  pEVar1[0x24].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x24].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)36>;
  pEVar1[0x24].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)36>;
  pEVar1[0x24].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x25].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x25].ExecuteFP = NSLogEvents::AllocateArrayAction_Execute;
  pEVar1[0x25].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x25].EmitFP =
       NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)37>;
  pEVar1[0x25].ParseFP =
       NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)37>;
  pEVar1[0x25].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x26].ContextKind = ContextAPIWrapper;
  pEVar1[0x26].ExecuteFP = NSLogEvents::AllocateArrayBufferAction_Execute;
  pEVar1[0x26].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x26].EmitFP =
       NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)38>;
  pEVar1[0x26].ParseFP =
       NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)38>;
  pEVar1[0x26].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x27].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x27].ExecuteFP = NSLogEvents::AllocateExternalArrayBufferAction_Execute;
  pEVar1[0x27].UnloadFP =
       NSLogEvents::JsRTByteBufferAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)39>;
  pEVar1[0x27].EmitFP = NSLogEvents::JsRTByteBufferAction_Emit<(TTD::NSLogEvents::EventKind)39>;
  pEVar1[0x27].ParseFP = NSLogEvents::JsRTByteBufferAction_Parse<(TTD::NSLogEvents::EventKind)39>;
  pEVar1[0x27].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x28].ContextKind = ContextAPIWrapper;
  pEVar1[0x28].ExecuteFP = NSLogEvents::AllocateFunctionAction_Execute;
  pEVar1[0x28].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x28].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)40>;
  pEVar1[0x28].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)40>;
  pEVar1[0x28].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x29].ContextKind = ContextAPIWrapper;
  pEVar1[0x29].ExecuteFP = NSLogEvents::HostProcessExitAction_Execute;
  pEVar1[0x29].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x29].EmitFP =
       NSLogEvents::JsRTIntegralArgumentAction_Emit<(TTD::NSLogEvents::EventKind)41>;
  pEVar1[0x29].ParseFP =
       NSLogEvents::JsRTIntegralArgumentAction_Parse<(TTD::NSLogEvents::EventKind)41>;
  pEVar1[0x29].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x2a].ContextKind = None;
  pEVar1[0x2a].ExecuteFP = NSLogEvents::GetAndClearExceptionWithMetadataAction_Execute;
  pEVar1[0x2a].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x2a].EmitFP = NSLogEvents::JsRTResultOnlyAction_Emit<(TTD::NSLogEvents::EventKind)42>;
  pEVar1[0x2a].ParseFP = NSLogEvents::JsRTResultOnlyAction_Parse<(TTD::NSLogEvents::EventKind)42>;
  pEVar1[0x2a].DataSize = 0x18;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x2b].ContextKind = None;
  pEVar1[0x2b].ExecuteFP = NSLogEvents::GetAndClearExceptionAction_Execute;
  pEVar1[0x2b].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x2b].EmitFP = NSLogEvents::JsRTResultOnlyAction_Emit<(TTD::NSLogEvents::EventKind)43>;
  pEVar1[0x2b].ParseFP = NSLogEvents::JsRTResultOnlyAction_Parse<(TTD::NSLogEvents::EventKind)43>;
  pEVar1[0x2b].DataSize = 0x18;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x2c].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x2c].ExecuteFP = NSLogEvents::SetExceptionAction_Execute;
  pEVar1[0x2c].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x2c].EmitFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)44>;
  pEVar1[0x2c].ParseFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)44>;
  pEVar1[0x2c].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x2d].ContextKind = ContextAPIWrapper;
  pEVar1[0x2d].ExecuteFP = NSLogEvents::HasPropertyAction_Execute;
  pEVar1[0x2d].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x2d].EmitFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)45>;
  pEVar1[0x2d].ParseFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)45>;
  pEVar1[0x2d].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x45].ContextKind = ContextAPIWrapper;
  pEVar1[0x45].ExecuteFP = NSLogEvents::HasOwnPropertyAction_Execute;
  pEVar1[0x45].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x45].EmitFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)69>;
  pEVar1[0x45].ParseFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)69>;
  pEVar1[0x45].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x2e].ContextKind = ContextAPIWrapper;
  pEVar1[0x2e].ExecuteFP = NSLogEvents::InstanceOfAction_Execute;
  pEVar1[0x2e].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x2e].EmitFP =
       NSLogEvents::JsRTDoubleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)46>;
  pEVar1[0x2e].ParseFP =
       NSLogEvents::JsRTDoubleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)46>;
  pEVar1[0x2e].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x2f].ContextKind = ContextAPIWrapper;
  pEVar1[0x2f].ExecuteFP = NSLogEvents::EqualsAction_Execute;
  pEVar1[0x2f].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x2f].EmitFP =
       NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)47>;
  pEVar1[0x2f].ParseFP =
       NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)47>;
  pEVar1[0x2f].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x30].ContextKind = ContextAPIWrapper;
  pEVar1[0x30].ExecuteFP = NSLogEvents::LessThanAction_Execute;
  pEVar1[0x30].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x30].EmitFP =
       NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)48>;
  pEVar1[0x30].ParseFP =
       NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)48>;
  pEVar1[0x30].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x31].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x31].ExecuteFP = NSLogEvents::GetPropertyIdFromSymbolAction_Execute;
  pEVar1[0x31].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x31].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)49>;
  pEVar1[0x31].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)49>;
  pEVar1[0x31].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x32].ContextKind = ContextAPIWrapper;
  pEVar1[0x32].ExecuteFP = NSLogEvents::GetPrototypeAction_Execute;
  pEVar1[0x32].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x32].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)50>;
  pEVar1[0x32].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)50>;
  pEVar1[0x32].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x33].ContextKind = ContextAPIWrapper;
  pEVar1[0x33].ExecuteFP = NSLogEvents::GetPropertyAction_Execute;
  pEVar1[0x33].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x33].EmitFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)51>;
  pEVar1[0x33].ParseFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)51>;
  pEVar1[0x33].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x34].ContextKind = ContextAPIWrapper;
  pEVar1[0x34].ExecuteFP = NSLogEvents::GetIndexAction_Execute;
  pEVar1[0x34].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x34].EmitFP =
       NSLogEvents::JsRTDoubleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)52>;
  pEVar1[0x34].ParseFP =
       NSLogEvents::JsRTDoubleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)52>;
  pEVar1[0x34].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x35].ContextKind = ContextAPIWrapper;
  pEVar1[0x35].ExecuteFP = NSLogEvents::GetOwnPropertyInfoAction_Execute;
  pEVar1[0x35].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x35].EmitFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)53>;
  pEVar1[0x35].ParseFP =
       NSLogEvents::JsRTSingleVarScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)53>;
  pEVar1[0x35].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x36].ContextKind = ContextAPIWrapper;
  pEVar1[0x36].ExecuteFP = NSLogEvents::GetOwnPropertyNamesInfoAction_Execute;
  pEVar1[0x36].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x36].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)54>;
  pEVar1[0x36].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)54>;
  pEVar1[0x36].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x37].ContextKind = ContextAPIWrapper;
  pEVar1[0x37].ExecuteFP = NSLogEvents::GetOwnPropertySymbolsInfoAction_Execute;
  pEVar1[0x37].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x37].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)55>;
  pEVar1[0x37].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)55>;
  pEVar1[0x37].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x38].ContextKind = ContextAPIWrapper;
  pEVar1[0x38].ExecuteFP = NSLogEvents::DefinePropertyAction_Execute;
  pEVar1[0x38].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x38].EmitFP =
       NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)56>;
  pEVar1[0x38].ParseFP =
       NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)56>;
  pEVar1[0x38].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x39].ContextKind = ContextAPIWrapper;
  pEVar1[0x39].ExecuteFP = NSLogEvents::DeletePropertyAction_Execute;
  pEVar1[0x39].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x39].EmitFP =
       NSLogEvents::JsRTSingleVarDoubleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)57>;
  pEVar1[0x39].ParseFP =
       NSLogEvents::JsRTSingleVarDoubleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)57>;
  pEVar1[0x39].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x3a].ContextKind = ContextAPIWrapper;
  pEVar1[0x3a].ExecuteFP = NSLogEvents::SetPrototypeAction_Execute;
  pEVar1[0x3a].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x3a].EmitFP =
       NSLogEvents::JsRTDoubleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)58>;
  pEVar1[0x3a].ParseFP =
       NSLogEvents::JsRTDoubleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)58>;
  pEVar1[0x3a].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x3b].ContextKind = ContextAPIWrapper;
  pEVar1[0x3b].ExecuteFP = NSLogEvents::SetPropertyAction_Execute;
  pEVar1[0x3b].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x3b].EmitFP =
       NSLogEvents::JsRTDoubleVarDoubleScalarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)59>;
  pEVar1[0x3b].ParseFP =
       NSLogEvents::JsRTDoubleVarDoubleScalarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)59>;
  pEVar1[0x3b].DataSize = 0x38;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x3c].ContextKind = ContextAPIWrapper;
  pEVar1[0x3c].ExecuteFP = NSLogEvents::SetIndexAction_Execute;
  pEVar1[0x3c].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x3c].EmitFP =
       NSLogEvents::JsRTTrippleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)60>;
  pEVar1[0x3c].ParseFP =
       NSLogEvents::JsRTTrippleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)60>;
  pEVar1[0x3c].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x3d].ContextKind = None;
  pEVar1[0x3d].ExecuteFP = NSLogEvents::GetTypedArrayInfoAction_Execute;
  pEVar1[0x3d].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x3d].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)61>;
  pEVar1[0x3d].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)61>;
  pEVar1[0x3d].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x46].ContextKind = None;
  pEVar1[0x46].ExecuteFP = NSLogEvents::GetDataViewInfoAction_Execute;
  pEVar1[0x46].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x46].EmitFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Emit<(TTD::NSLogEvents::EventKind)70>;
  pEVar1[0x46].ParseFP =
       NSLogEvents::JsRTSingleVarArgumentAction_Parse<(TTD::NSLogEvents::EventKind)70>;
  pEVar1[0x46].DataSize = 0x20;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x3e].ContextKind = ContextAPIWrapper;
  pEVar1[0x3e].ExecuteFP = NSLogEvents::RawBufferCopySync_Execute;
  pEVar1[0x3e].UnloadFP = (fPtr_EventLogEntryInfoUnload)0x0;
  pEVar1[0x3e].EmitFP = NSLogEvents::JsRTRawBufferCopyAction_Emit;
  pEVar1[0x3e].ParseFP = NSLogEvents::JsRTRawBufferCopyAction_Parse;
  pEVar1[0x3e].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x3f].ContextKind = ContextAPIWrapper;
  pEVar1[0x3f].ExecuteFP = NSLogEvents::RawBufferModifySync_Execute;
  pEVar1[0x3f].UnloadFP =
       NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)63>;
  pEVar1[0x3f].EmitFP = NSLogEvents::JsRTRawBufferModifyAction_Emit<(TTD::NSLogEvents::EventKind)63>
  ;
  pEVar1[0x3f].ParseFP =
       NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)63>;
  pEVar1[0x3f].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x40].ContextKind = ContextAPIWrapper;
  pEVar1[0x40].ExecuteFP = NSLogEvents::RawBufferAsyncModificationRegister_Execute;
  pEVar1[0x40].UnloadFP =
       NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)64>;
  pEVar1[0x40].EmitFP = NSLogEvents::JsRTRawBufferModifyAction_Emit<(TTD::NSLogEvents::EventKind)64>
  ;
  pEVar1[0x40].ParseFP =
       NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)64>;
  pEVar1[0x40].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x41].ContextKind = ContextAPIWrapper;
  pEVar1[0x41].ExecuteFP = NSLogEvents::RawBufferAsyncModifyComplete_Execute;
  pEVar1[0x41].UnloadFP =
       NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<(TTD::NSLogEvents::EventKind)65>;
  pEVar1[0x41].EmitFP = NSLogEvents::JsRTRawBufferModifyAction_Emit<(TTD::NSLogEvents::EventKind)65>
  ;
  pEVar1[0x41].ParseFP =
       NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)65>;
  pEVar1[0x41].DataSize = 0x28;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x42].ContextKind = ContextAPIWrapper;
  pEVar1[0x42].ExecuteFP = NSLogEvents::JsRTConstructCallAction_Execute;
  pEVar1[0x42].UnloadFP = NSLogEvents::JsRTConstructCallAction_UnloadEventMemory;
  pEVar1[0x42].EmitFP = NSLogEvents::JsRTConstructCallAction_Emit;
  pEVar1[0x42].ParseFP = NSLogEvents::JsRTConstructCallAction_Parse;
  pEVar1[0x42].DataSize = 0x30;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x43].ContextKind = ContextAPINoScriptWrapper;
  pEVar1[0x43].ExecuteFP = NSLogEvents::JsRTCodeParseAction_Execute;
  pEVar1[0x43].UnloadFP = NSLogEvents::JsRTCodeParseAction_UnloadEventMemory;
  pEVar1[0x43].EmitFP = NSLogEvents::JsRTCodeParseAction_Emit;
  pEVar1[0x43].ParseFP = NSLogEvents::JsRTCodeParseAction_Parse;
  pEVar1[0x43].DataSize = 0x50;
  pEVar1 = this->m_eventListVTable;
  pEVar1[0x44].ContextKind = ContextAPIWrapper;
  pEVar1[0x44].ExecuteFP = NSLogEvents::JsRTCallFunctionAction_Execute;
  pEVar1[0x44].UnloadFP = NSLogEvents::JsRTCallFunctionAction_UnloadEventMemory;
  pEVar1[0x44].EmitFP = NSLogEvents::JsRTCallFunctionAction_Emit;
  pEVar1[0x44].ParseFP = NSLogEvents::JsRTCallFunctionAction_Parse;
  pEVar1[0x44].DataSize = 0x58;
  return;
}

Assistant:

void EventLog::InitializeEventListVTable()
    {
        this->m_eventListVTable = this->m_miscSlabAllocator.SlabAllocateArray<NSLogEvents::EventLogEntryVTableEntry>((uint32)NSLogEvents::EventKind::Count);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(SnapshotTag, GlobalAPIWrapper, SnapshotEventLogEntry, nullptr, NSLogEvents::SnapshotEventLogEntry_UnloadEventMemory, NSLogEvents::SnapshotEventLogEntry_Emit, NSLogEvents::SnapshotEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(EventLoopYieldPointTag, GlobalAPIWrapper, EventLoopYieldPointEntry, nullptr, nullptr, NSLogEvents::EventLoopYieldPointEntry_Emit, NSLogEvents::EventLoopYieldPointEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TopLevelCodeTag, None, CodeLoadEventLogEntry, nullptr, nullptr, NSLogEvents::CodeLoadEventLogEntry_Emit, NSLogEvents::CodeLoadEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TelemetryLogTag, None, TelemetryEventLogEntry, nullptr, NSLogEvents::TelemetryEventLogEntry_UnloadEventMemory, NSLogEvents::TelemetryEventLogEntry_Emit, NSLogEvents::TelemetryEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(DoubleTag, None, DoubleEventLogEntry, nullptr, nullptr, NSLogEvents::DoubleEventLogEntry_Emit, NSLogEvents::DoubleEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(StringTag, None, StringValueEventLogEntry, nullptr, NSLogEvents::StringValueEventLogEntry_UnloadEventMemory, NSLogEvents::StringValueEventLogEntry_Emit, NSLogEvents::StringValueEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RandomSeedTag, None, RandomSeedEventLogEntry, nullptr, nullptr, NSLogEvents::RandomSeedEventLogEntry_Emit, NSLogEvents::RandomSeedEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(PropertyEnumTag, None, PropertyEnumStepEventLogEntry, nullptr, NSLogEvents::PropertyEnumStepEventLogEntry_UnloadEventMemory, NSLogEvents::PropertyEnumStepEventLogEntry_Emit, NSLogEvents::PropertyEnumStepEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(SymbolCreationTag, None, SymbolCreationEventLogEntry, nullptr, nullptr, NSLogEvents::SymbolCreationEventLogEntry_Emit, NSLogEvents::SymbolCreationEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(WeakCollectionContainsTag, None, WeakCollectionContainsEventLogEntry, nullptr, nullptr, NSLogEvents::WeakCollectionContainsEventLogEntry_Emit, NSLogEvents::WeakCollectionContainsEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ExternalCbRegisterCall, None, ExternalCbRegisterCallEventLogEntry, nullptr, nullptr, NSLogEvents::ExternalCbRegisterCallEventLogEntry_Emit, NSLogEvents::ExternalCbRegisterCallEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ExternalCallTag, None, ExternalCallEventLogEntry, nullptr, NSLogEvents::ExternalCallEventLogEntry_UnloadEventMemory, NSLogEvents::ExternalCallEventLogEntry_Emit, NSLogEvents::ExternalCallEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ExplicitLogWriteTag, None, ExplicitLogWriteEventLogEntry, nullptr, nullptr, NSLogEvents::ExplicitLogWriteEntry_Emit, NSLogEvents::ExplicitLogWriteEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TTDInnerLoopLogWriteTag, None, TTDInnerLoopLogWriteEventLogEntry, nullptr, nullptr, NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Emit, NSLogEvents::TTDInnerLoopLogWriteEventLogEntry_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(TTDFetchAutoTraceStatusTag, None, TTDFetchAutoTraceStatusEventLogEntry, nullptr, nullptr, NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Emit, NSLogEvents::TTDFetchAutoTraceStatusEventLogEntry_Parse);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CreateScriptContextActionTag, GlobalAPIWrapper, JsRTCreateScriptContextAction, NSLogEvents::CreateScriptContext_Execute, NSLogEvents::CreateScriptContext_UnloadEventMemory, NSLogEvents::CreateScriptContext_Emit, NSLogEvents::CreateScriptContext_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetActiveScriptContextActionTag, GlobalAPIWrapper, JsRTSingleVarArgumentAction, SetActiveScriptContext_Execute);

#if !INT32VAR
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateIntegerActionTag, ContextAPINoScriptWrapper, JsRTIntegralArgumentAction, CreateInt_Execute);
#endif

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CreateNumberActionTag, ContextAPINoScriptWrapper, JsRTDoubleArgumentAction, NSLogEvents::CreateNumber_Execute, nullptr, NSLogEvents::JsRTDoubleArgumentAction_Emit<NSLogEvents::EventKind::CreateNumberActionTag>, NSLogEvents::JsRTDoubleArgumentAction_Parse<NSLogEvents::EventKind::CreateNumberActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateBooleanActionTag, ContextAPINoScriptWrapper, JsRTIntegralArgumentAction, CreateBoolean_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CreateStringActionTag, ContextAPINoScriptWrapper, JsRTStringArgumentAction, NSLogEvents::CreateString_Execute, NSLogEvents::JsRTStringArgumentAction_UnloadEventMemory<NSLogEvents::EventKind::CreateStringActionTag>, NSLogEvents::JsRTStringArgumentAction_Emit<NSLogEvents::EventKind::CreateStringActionTag>, NSLogEvents::JsRTStringArgumentAction_Parse<NSLogEvents::EventKind::CreateStringActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateSymbolActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateSymbol_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateRangeErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateRangeErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateReferenceErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateReferenceErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateSyntaxErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateSyntaxErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateTypeErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateTypeErrorActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(CreateURIErrorActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, CreateError_Execute<NSLogEvents::EventKind::CreateURIErrorActionTag>);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToNumberActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToNumber_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToBooleanActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToBoolean_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToStringActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToString_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(VarConvertToObjectActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, VarConvertToObject_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AddRootRefActionTag, GlobalAPIWrapper, JsRTSingleVarArgumentAction, AddRootRef_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AddWeakRootRefActionTag, GlobalAPIWrapper, JsRTSingleVarArgumentAction, AddWeakRootRef_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateObjectActionTag, ContextAPINoScriptWrapper, JsRTResultOnlyAction, AllocateObject_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateExternalObjectActionTag, ContextAPINoScriptWrapper, JsRTSingleVarArgumentAction, AllocateExternalObject_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateArrayActionTag, ContextAPINoScriptWrapper, JsRTIntegralArgumentAction, AllocateArrayAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateArrayBufferActionTag, ContextAPIWrapper, JsRTIntegralArgumentAction, AllocateArrayBufferAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(AllocateExternalArrayBufferActionTag, ContextAPINoScriptWrapper, JsRTByteBufferAction, NSLogEvents::AllocateExternalArrayBufferAction_Execute, NSLogEvents::JsRTByteBufferAction_UnloadEventMemory<NSLogEvents::EventKind::AllocateExternalArrayBufferActionTag>, NSLogEvents::JsRTByteBufferAction_Emit<NSLogEvents::EventKind::AllocateExternalArrayBufferActionTag>, NSLogEvents::JsRTByteBufferAction_Parse<NSLogEvents::EventKind::AllocateExternalArrayBufferActionTag>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(AllocateFunctionActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, AllocateFunctionAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(HostExitProcessTag, ContextAPIWrapper, JsRTIntegralArgumentAction, HostProcessExitAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetAndClearExceptionWithMetadataActionTag, None, JsRTResultOnlyAction, GetAndClearExceptionWithMetadataAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetAndClearExceptionActionTag, None, JsRTResultOnlyAction, GetAndClearExceptionAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetExceptionActionTag, ContextAPINoScriptWrapper, JsRTSingleVarScalarArgumentAction, SetExceptionAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(HasPropertyActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, HasPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(HasOwnPropertyActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, HasOwnPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(InstanceOfActionTag, ContextAPIWrapper, JsRTDoubleVarArgumentAction, InstanceOfAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(EqualsActionTag, ContextAPIWrapper, JsRTDoubleVarSingleScalarArgumentAction, EqualsAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(LessThanActionTag, ContextAPIWrapper, JsRTDoubleVarSingleScalarArgumentAction, LessThanAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetPropertyIdFromSymbolTag, ContextAPINoScriptWrapper, JsRTSingleVarArgumentAction, GetPropertyIdFromSymbolAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetPrototypeActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, GetPrototypeAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetPropertyActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, GetPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetIndexActionTag, ContextAPIWrapper, JsRTDoubleVarArgumentAction, GetIndexAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetOwnPropertyInfoActionTag, ContextAPIWrapper, JsRTSingleVarScalarArgumentAction, GetOwnPropertyInfoAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetOwnPropertyNamesInfoActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, GetOwnPropertyNamesInfoAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetOwnPropertySymbolsInfoActionTag, ContextAPIWrapper, JsRTSingleVarArgumentAction, GetOwnPropertySymbolsInfoAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(DefinePropertyActionTag, ContextAPIWrapper, JsRTDoubleVarSingleScalarArgumentAction, DefinePropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(DeletePropertyActionTag, ContextAPIWrapper, JsRTSingleVarDoubleScalarArgumentAction, DeletePropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetPrototypeActionTag, ContextAPIWrapper, JsRTDoubleVarArgumentAction, SetPrototypeAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetPropertyActionTag, ContextAPIWrapper, JsRTDoubleVarDoubleScalarArgumentAction, SetPropertyAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(SetIndexActionTag, ContextAPIWrapper, JsRTTrippleVarArgumentAction, SetIndexAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetTypedArrayInfoActionTag, None, JsRTSingleVarArgumentAction, GetTypedArrayInfoAction_Execute);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY_COMMON(GetDataViewInfoActionTag, None, JsRTSingleVarArgumentAction, GetDataViewInfoAction_Execute);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferCopySync, ContextAPIWrapper, JsRTRawBufferCopyAction, NSLogEvents::RawBufferCopySync_Execute, nullptr, NSLogEvents::JsRTRawBufferCopyAction_Emit, NSLogEvents::JsRTRawBufferCopyAction_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferModifySync, ContextAPIWrapper, JsRTRawBufferModifyAction, NSLogEvents::RawBufferModifySync_Execute, NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<NSLogEvents::EventKind::RawBufferModifySync>, NSLogEvents::JsRTRawBufferModifyAction_Emit<NSLogEvents::EventKind::RawBufferModifySync>, NSLogEvents::JsRTRawBufferModifyAction_Parse<NSLogEvents::EventKind::RawBufferModifySync>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferAsyncModificationRegister, ContextAPIWrapper, JsRTRawBufferModifyAction, NSLogEvents::RawBufferAsyncModificationRegister_Execute, NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<NSLogEvents::EventKind::RawBufferAsyncModificationRegister>, NSLogEvents::JsRTRawBufferModifyAction_Emit<NSLogEvents::EventKind::RawBufferAsyncModificationRegister>, NSLogEvents::JsRTRawBufferModifyAction_Parse<NSLogEvents::EventKind::RawBufferAsyncModificationRegister>);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(RawBufferAsyncModifyComplete, ContextAPIWrapper, JsRTRawBufferModifyAction, NSLogEvents::RawBufferAsyncModifyComplete_Execute, NSLogEvents::JsRTRawBufferModifyAction_UnloadEventMemory<NSLogEvents::EventKind::RawBufferAsyncModifyComplete>, NSLogEvents::JsRTRawBufferModifyAction_Emit<NSLogEvents::EventKind::RawBufferAsyncModifyComplete>, NSLogEvents::JsRTRawBufferModifyAction_Parse<NSLogEvents::EventKind::RawBufferAsyncModifyComplete>);

        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(ConstructCallActionTag, ContextAPIWrapper, JsRTConstructCallAction, NSLogEvents::JsRTConstructCallAction_Execute, NSLogEvents::JsRTConstructCallAction_UnloadEventMemory, NSLogEvents::JsRTConstructCallAction_Emit, NSLogEvents::JsRTConstructCallAction_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CodeParseActionTag, ContextAPINoScriptWrapper, JsRTCodeParseAction, NSLogEvents::JsRTCodeParseAction_Execute, NSLogEvents::JsRTCodeParseAction_UnloadEventMemory, NSLogEvents::JsRTCodeParseAction_Emit, NSLogEvents::JsRTCodeParseAction_Parse);
        TTD_CREATE_EVENTLIST_VTABLE_ENTRY(CallExistingFunctionActionTag, ContextAPIWrapper, JsRTCallFunctionAction, NSLogEvents::JsRTCallFunctionAction_Execute, NSLogEvents::JsRTCallFunctionAction_UnloadEventMemory, NSLogEvents::JsRTCallFunctionAction_Emit, NSLogEvents::JsRTCallFunctionAction_Parse);
    }